

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextVkImpl.hpp
# Opt level: O1

void __thiscall
Diligent::DeviceContextVkImpl::AddWaitSemaphore
          (DeviceContextVkImpl *this,ManagedSemaphore *pWaitSemaphore,
          VkPipelineStageFlags WaitDstStageMask)

{
  pointer *pppVVar1;
  iterator __position;
  iterator __position_00;
  iterator __position_01;
  char (*in_RCX) [26];
  string msg;
  uint local_3c;
  string local_38;
  ManagedSemaphore *local_18;
  
  local_3c = WaitDstStageMask;
  local_18 = pWaitSemaphore;
  if (pWaitSemaphore == (ManagedSemaphore *)0x0) {
    FormatString<char[26],char[26]>
              (&local_38,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"pWaitSemaphore != nullptr",in_RCX);
    DebugAssertionFailed
              (local_38._M_dataplus._M_p,"AddWaitSemaphore",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/include/DeviceContextVkImpl.hpp"
               ,0x154);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
  }
  std::
  vector<Diligent::RefCntAutoPtr<Diligent::ManagedVulkanObject<VulkanUtilities::VulkanObjectWrapper<VkSemaphore_T*,(VulkanUtilities::VulkanHandleTypeId)17>>>,std::allocator<Diligent::RefCntAutoPtr<Diligent::ManagedVulkanObject<VulkanUtilities::VulkanObjectWrapper<VkSemaphore_T*,(VulkanUtilities::VulkanHandleTypeId)17>>>>>
  ::
  emplace_back<Diligent::ManagedVulkanObject<VulkanUtilities::VulkanObjectWrapper<VkSemaphore_T*,(VulkanUtilities::VulkanHandleTypeId)17>>*&>
            ((vector<Diligent::RefCntAutoPtr<Diligent::ManagedVulkanObject<VulkanUtilities::VulkanObjectWrapper<VkSemaphore_T*,(VulkanUtilities::VulkanHandleTypeId)17>>>,std::allocator<Diligent::RefCntAutoPtr<Diligent::ManagedVulkanObject<VulkanUtilities::VulkanObjectWrapper<VkSemaphore_T*,(VulkanUtilities::VulkanHandleTypeId)17>>>>>
              *)&this->m_WaitManagedSemaphores,&local_18);
  local_38._M_dataplus._M_p = (pointer)(local_18->m_VkObject).m_VkObject;
  __position._M_current =
       (this->m_VkWaitSemaphores).
       super__Vector_base<VkSemaphore_T_*,_std::allocator<VkSemaphore_T_*>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->m_VkWaitSemaphores).
      super__Vector_base<VkSemaphore_T_*,_std::allocator<VkSemaphore_T_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<VkSemaphore_T*,std::allocator<VkSemaphore_T*>>::_M_realloc_insert<VkSemaphore_T*>
              ((vector<VkSemaphore_T*,std::allocator<VkSemaphore_T*>> *)&this->m_VkWaitSemaphores,
               __position,(VkSemaphore_T **)&local_38);
  }
  else {
    *__position._M_current = (VkSemaphore_T *)local_38._M_dataplus._M_p;
    pppVVar1 = &(this->m_VkWaitSemaphores).
                super__Vector_base<VkSemaphore_T_*,_std::allocator<VkSemaphore_T_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
    *pppVVar1 = *pppVVar1 + 1;
  }
  __position_00._M_current =
       (this->m_WaitDstStageMasks).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  if (__position_00._M_current ==
      (this->m_WaitDstStageMasks).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_realloc_insert<unsigned_int_const&>
              ((vector<unsigned_int,std::allocator<unsigned_int>> *)&this->m_WaitDstStageMasks,
               __position_00,&local_3c);
  }
  else {
    *__position_00._M_current = local_3c;
    (this->m_WaitDstStageMasks).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
    _M_impl.super__Vector_impl_data._M_finish = __position_00._M_current + 1;
  }
  local_38._M_dataplus._M_p = (pointer)0x0;
  __position_01._M_current =
       (this->m_WaitSemaphoreValues).
       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (__position_01._M_current ==
      (this->m_WaitSemaphoreValues).
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_realloc_insert<unsigned_long>
              (&this->m_WaitSemaphoreValues,__position_01,(unsigned_long *)&local_38);
  }
  else {
    *__position_01._M_current = 0;
    (this->m_WaitSemaphoreValues).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
    _M_impl.super__Vector_impl_data._M_finish = __position_01._M_current + 1;
  }
  return;
}

Assistant:

void AddWaitSemaphore(ManagedSemaphore* pWaitSemaphore, VkPipelineStageFlags WaitDstStageMask)
    {
        VERIFY_EXPR(pWaitSemaphore != nullptr);
        m_WaitManagedSemaphores.emplace_back(pWaitSemaphore);
        m_VkWaitSemaphores.push_back(pWaitSemaphore->Get());
        m_WaitDstStageMasks.push_back(WaitDstStageMask);
        m_WaitSemaphoreValues.push_back(0); // Ignored for binary semaphore
    }